

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  int *piVar6;
  undefined8 in_RCX;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  sexp_conflict sexp_termios_type_obj;
  sexp_conflict sexp_winsize_type_obj;
  int **local_98;
  undefined8 local_90;
  int *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  long local_48;
  char *local_40;
  char *local_38;
  undefined8 local_30;
  long local_18;
  
  local_58 = 0x43e;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_18 = in_RDI;
  memset(&local_68,0,0x10);
  local_70 = 0x43e;
  memset(&local_80,0,0x10);
  local_88 = (int *)0x43e;
  memset(&local_98,0,0x10);
  iVar2 = strcmp(local_38,"0.11.0");
  if ((iVar2 == 0) && (iVar2 = strncmp(local_40,"cv-gm*uh",8), iVar2 == 0)) {
    local_68 = &local_58;
    local_60 = *(undefined8 *)(local_18 + 0x6080);
    *(undefined8 ***)(local_18 + 0x6080) = &local_68;
    local_80 = &local_70;
    local_78 = *(undefined8 *)(local_18 + 0x6080);
    *(undefined8 ***)(local_18 + 0x6080) = &local_80;
    local_98 = &local_88;
    local_90 = *(undefined8 *)(local_18 + 0x6080);
    *(int ****)(local_18 + 0x6080) = &local_98;
    uVar3 = sexp_intern(local_18,"VREPRINT",8);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0xc,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VLNEXT");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0xf,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VSTOP");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,9,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VSTART",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,8,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VSUSP",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,10,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VQUIT",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VKILL",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,3,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VINTR",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VWERASE");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0xe,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VERASE",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,2,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VEOL2",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x10,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VEOL");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0xb,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"VEOF",4);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,4,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"NOFLSH",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x80,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"FLUSHO",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x1000,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"TOSTOP",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x100,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"IEXTEN",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x8000,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ICANON",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,2,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ISIG",4);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ECHOCTL",7);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x200,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ECHONL",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x40,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ECHO",4);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,8,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ECHOE",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x10,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ECHOKE",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x800,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"CRTSCTS",7);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x80000000,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"CLOCAL",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x800,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"HUPCL",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x400,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"PARODD",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x200,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"PARENB",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x100,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"CREAD",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x80,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"CSTOPB",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x40,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"CS8");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x30,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"CS7",3);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x20,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"CS6",3);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x10,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"CS5",3);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"CSIZE",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x30,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ONLRET",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x20,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ONOCR",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x10,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"OCRNL",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,8,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ONLCR",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,4,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"OPOST",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"IMAXBEL",7);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x2000,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"IXANY",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x800,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"IXOFF",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x1000,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"IXON",4);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x400,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ICRNL",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x100,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"IGNCR",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x80,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"INLCR",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x40,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ISTRIP",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x20,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"INPCK",5);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,0x10,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"PARMRK",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,8,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"IGNPAR",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,4,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"BRKINT",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,2,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"IGNBRK",6);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_unsigned_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"TCSAFLUSH");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,2,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"TCSADRAIN",9);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"TCSANOW",7);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"TIOCGWINSZ",10);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0x5413,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    local_58 = sexp_c_string(local_18,"winsize",0xffffffffffffffff);
    local_48 = sexp_register_type_op
                         (local_18,0,0x12,local_58,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                          "sexp_finalize_c_type",sexp_finalize_c_type);
    local_70 = sexp_string_to_symbol_op(local_18,0,1,local_58);
    sexp_env_define(local_18,local_30,local_70,local_48);
    lVar1 = local_18;
    *(undefined8 *)(local_48 + 0x18) = 0x23e;
    lVar4 = local_48 + 0x18;
    uVar5 = sexp_intern(local_18,"ws_col",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_48 + 0x18;
    uVar5 = sexp_intern(local_18,"ws_row",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    uVar5 = sexp_make_vector_op(local_18,0,2,5,0x3e);
    *(undefined8 *)(local_48 + 0x20) = uVar5;
    uVar5 = sexp_make_vector_op(local_18,0,2,5,0x3e);
    *(undefined8 *)(local_48 + 0x28) = uVar5;
    local_70 = sexp_make_type_predicate_op(local_18,0,2,local_58,local_48);
    local_58 = sexp_intern(local_18,"winsize?",8);
    sexp_env_define(local_18,local_30,local_58,local_70);
    local_58 = sexp_c_string(local_18,"termios",0xffffffffffffffff);
    local_50 = sexp_register_type_op
                         (local_18,0,0x12,local_58,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                          "sexp_finalize_c_type",sexp_finalize_c_type);
    local_70 = sexp_string_to_symbol_op(local_18,0,1,local_58);
    sexp_env_define(local_18,local_30,local_70,local_50);
    lVar1 = local_18;
    *(undefined8 *)(local_50 + 0x18) = 0x23e;
    lVar4 = local_50 + 0x18;
    uVar5 = sexp_intern(local_18,"c_lflag",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_50 + 0x18;
    uVar5 = sexp_intern(local_18,"c_cflag",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_50 + 0x18;
    uVar5 = sexp_intern(local_18,"c_oflag",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_50 + 0x18;
    uVar5 = sexp_intern(local_18,"c_iflag",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    uVar5 = sexp_make_vector_op(local_18,0,2,9,0x3e);
    *(undefined8 *)(local_50 + 0x20) = uVar5;
    uVar5 = sexp_make_vector_op(local_18,0,2,9,0x3e);
    *(undefined8 *)(local_50 + 0x28) = uVar5;
    local_70 = sexp_make_type_predicate_op(local_18,0,2,local_58,local_50);
    local_58 = sexp_intern(local_18,"term-attrs?",0xb);
    sexp_env_define(local_18,local_30,local_58,local_70);
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-lflag-set!",2,0,
                                 "sexp_termios_set_c_lflag",sexp_termios_set_c_lflag,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    if (((*(ulong *)(local_50 + 0x28) & 3) == 0) && (**(int **)(local_50 + 0x28) == 10)) {
      *(int **)(*(long *)(local_50 + 0x28) + 0x28) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-lflag",1,0,"sexp_termios_get_c_lflag"
                                 ,sexp_termios_get_c_lflag,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x28) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-cflag-set!",2,0,
                                 "sexp_termios_set_c_cflag",sexp_termios_set_c_cflag,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    if (((*(ulong *)(local_50 + 0x28) & 3) == 0) && (**(int **)(local_50 + 0x28) == 10)) {
      *(int **)(*(long *)(local_50 + 0x28) + 0x20) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-cflag",1,0,"sexp_termios_get_c_cflag"
                                 ,sexp_termios_get_c_cflag,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x20) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-oflag-set!",2,0,
                                 "sexp_termios_set_c_oflag",sexp_termios_set_c_oflag,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    if (((*(ulong *)(local_50 + 0x28) & 3) == 0) && (**(int **)(local_50 + 0x28) == 10)) {
      *(int **)(*(long *)(local_50 + 0x28) + 0x18) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-oflag",1,0,"sexp_termios_get_c_oflag"
                                 ,sexp_termios_get_c_oflag,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x18) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-iflag-set!",2,0,
                                 "sexp_termios_set_c_iflag",sexp_termios_set_c_iflag,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    if (((*(ulong *)(local_50 + 0x28) & 3) == 0) && (**(int **)(local_50 + 0x28) == 10)) {
      *(int **)(*(long *)(local_50 + 0x28) + 0x10) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-iflag",1,0,"sexp_termios_get_c_iflag"
                                 ,sexp_termios_get_c_iflag,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x10) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"make-term-attrs",0,0,"sexp_make_term_attrs_stub"
                                 ,sexp_make_term_attrs_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      *(ulong *)(local_88 + 10) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"winsize-col",1,0,"sexp_winsize_get_ws_col",
                                 sexp_winsize_get_ws_col,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x18) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"winsize-row",1,0,"sexp_winsize_get_ws_row",
                                 sexp_winsize_get_ws_row,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x10) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"make-winsize",2,0,"sexp_make_winsize_stub",
                                 sexp_make_winsize_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      *(ulong *)(local_88 + 10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"set-terminal-attributes!",3,0,
                                 "sexp_set_terminal_attributes_x_stub",
                                 sexp_set_terminal_attributes_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 1;
      local_88[0xd] = 0;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
      *(ulong *)(local_88 + 0x10) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"get-terminal-attributes",1,0,
                                 "sexp_get_terminal_attributes_stub",
                                 sexp_get_terminal_attributes_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 1;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"ioctl",2,0,"sexp_ioctl_stub",sexp_ioctl_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 1;
      local_88[0xd] = 0;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
      *(ulong *)(local_88 + 0x10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-ospeed-set!",2,0,
                                 "sexp_term_attrs_ospeed_set_x_stub",
                                 sexp_term_attrs_ospeed_set_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-ispeed-set!",2,0,
                                 "sexp_term_attrs_ispeed_set_x_stub",
                                 sexp_term_attrs_ispeed_set_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"term-attrs-ospeed",1,0,
                                 "sexp_term_attrs_ospeed_stub",sexp_term_attrs_ospeed_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    piVar6 = (int *)sexp_define_foreign_aux
                              (local_18,local_30,"term-attrs-ispeed",1,0,
                               "sexp_term_attrs_ispeed_stub",sexp_term_attrs_ispeed_stub,0);
    if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 0x1b)) {
      piVar6[10] = 5;
      piVar6[0xb] = 0;
      *(ulong *)(piVar6 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    *(undefined8 *)(local_18 + 0x6080) = local_60;
    return (sexp_conflict)0x43e;
  }
  return (sexp_conflict)0xb3e;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp sexp_winsize_type_obj;
  sexp sexp_termios_type_obj;
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_intern(ctx, "VREPRINT", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VREPRINT));
  name = sexp_intern(ctx, "VLNEXT", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VLNEXT));
  name = sexp_intern(ctx, "VSTOP", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VSTOP));
  name = sexp_intern(ctx, "VSTART", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VSTART));
  name = sexp_intern(ctx, "VSUSP", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VSUSP));
  name = sexp_intern(ctx, "VQUIT", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VQUIT));
  name = sexp_intern(ctx, "VKILL", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VKILL));
  name = sexp_intern(ctx, "VINTR", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VINTR));
  name = sexp_intern(ctx, "VWERASE", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VWERASE));
  name = sexp_intern(ctx, "VERASE", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VERASE));
  name = sexp_intern(ctx, "VEOL2", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VEOL2));
  name = sexp_intern(ctx, "VEOL", 4);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VEOL));
  name = sexp_intern(ctx, "VEOF", 4);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VEOF));
  name = sexp_intern(ctx, "NOFLSH", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, NOFLSH));
  name = sexp_intern(ctx, "FLUSHO", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, FLUSHO));
  name = sexp_intern(ctx, "TOSTOP", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, TOSTOP));
  name = sexp_intern(ctx, "IEXTEN", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IEXTEN));
  name = sexp_intern(ctx, "ICANON", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ICANON));
  name = sexp_intern(ctx, "ISIG", 4);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ISIG));
  name = sexp_intern(ctx, "ECHOCTL", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ECHOCTL));
  name = sexp_intern(ctx, "ECHONL", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ECHONL));
  name = sexp_intern(ctx, "ECHO", 4);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ECHO));
  name = sexp_intern(ctx, "ECHOE", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ECHOE));
  name = sexp_intern(ctx, "ECHOKE", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ECHOKE));
  name = sexp_intern(ctx, "CRTSCTS", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CRTSCTS));
  name = sexp_intern(ctx, "CLOCAL", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CLOCAL));
  name = sexp_intern(ctx, "HUPCL", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, HUPCL));
  name = sexp_intern(ctx, "PARODD", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, PARODD));
  name = sexp_intern(ctx, "PARENB", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, PARENB));
  name = sexp_intern(ctx, "CREAD", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CREAD));
  name = sexp_intern(ctx, "CSTOPB", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CSTOPB));
  name = sexp_intern(ctx, "CS8", 3);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CS8));
  name = sexp_intern(ctx, "CS7", 3);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CS7));
  name = sexp_intern(ctx, "CS6", 3);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CS6));
  name = sexp_intern(ctx, "CS5", 3);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CS5));
  name = sexp_intern(ctx, "CSIZE", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CSIZE));
  name = sexp_intern(ctx, "ONLRET", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ONLRET));
  name = sexp_intern(ctx, "ONOCR", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ONOCR));
  name = sexp_intern(ctx, "OCRNL", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, OCRNL));
  name = sexp_intern(ctx, "ONLCR", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ONLCR));
  name = sexp_intern(ctx, "OPOST", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, OPOST));
  name = sexp_intern(ctx, "IMAXBEL", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IMAXBEL));
  name = sexp_intern(ctx, "IXANY", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IXANY));
  name = sexp_intern(ctx, "IXOFF", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IXOFF));
  name = sexp_intern(ctx, "IXON", 4);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IXON));
  name = sexp_intern(ctx, "ICRNL", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ICRNL));
  name = sexp_intern(ctx, "IGNCR", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IGNCR));
  name = sexp_intern(ctx, "INLCR", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, INLCR));
  name = sexp_intern(ctx, "ISTRIP", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ISTRIP));
  name = sexp_intern(ctx, "INPCK", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, INPCK));
  name = sexp_intern(ctx, "PARMRK", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, PARMRK));
  name = sexp_intern(ctx, "IGNPAR", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IGNPAR));
  name = sexp_intern(ctx, "BRKINT", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, BRKINT));
  name = sexp_intern(ctx, "IGNBRK", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IGNBRK));
  name = sexp_intern(ctx, "TCSAFLUSH", 9);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, TCSAFLUSH));
  name = sexp_intern(ctx, "TCSADRAIN", 9);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, TCSADRAIN));
  name = sexp_intern(ctx, "TCSANOW", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, TCSANOW));
  name = sexp_intern(ctx, "TIOCGWINSZ", 10);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, TIOCGWINSZ));
  name = sexp_c_string(ctx, "winsize", -1);
  sexp_winsize_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_winsize_type_obj);
  sexp_type_slots(sexp_winsize_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_winsize_type_obj), sexp_intern(ctx, "ws_col", -1));
  sexp_push(ctx, sexp_type_slots(sexp_winsize_type_obj), sexp_intern(ctx, "ws_row", -1));
  sexp_type_getters(sexp_winsize_type_obj) = sexp_make_vector(ctx, SEXP_TWO, SEXP_FALSE);
  sexp_type_setters(sexp_winsize_type_obj) = sexp_make_vector(ctx, SEXP_TWO, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_winsize_type_obj);
  name = sexp_intern(ctx, "winsize?", 8);
  sexp_env_define(ctx, env, name, tmp);
  name = sexp_c_string(ctx, "termios", -1);
  sexp_termios_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_termios_type_obj);
  sexp_type_slots(sexp_termios_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_termios_type_obj), sexp_intern(ctx, "c_lflag", -1));
  sexp_push(ctx, sexp_type_slots(sexp_termios_type_obj), sexp_intern(ctx, "c_cflag", -1));
  sexp_push(ctx, sexp_type_slots(sexp_termios_type_obj), sexp_intern(ctx, "c_oflag", -1));
  sexp_push(ctx, sexp_type_slots(sexp_termios_type_obj), sexp_intern(ctx, "c_iflag", -1));
  sexp_type_getters(sexp_termios_type_obj) = sexp_make_vector(ctx, SEXP_FOUR, SEXP_FALSE);
  sexp_type_setters(sexp_termios_type_obj) = sexp_make_vector(ctx, SEXP_FOUR, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_termios_type_obj);
  name = sexp_intern(ctx, "term-attrs?", 11);
  sexp_env_define(ctx, env, name, tmp);
  op = sexp_define_foreign(ctx, env, "term-attrs-lflag-set!", 2, sexp_termios_set_c_lflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  if (sexp_vectorp(sexp_type_setters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_setters(sexp_termios_type_obj), SEXP_THREE, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-lflag", 1, sexp_termios_get_c_lflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_getters(sexp_termios_type_obj), SEXP_THREE, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-cflag-set!", 2, sexp_termios_set_c_cflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  if (sexp_vectorp(sexp_type_setters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_setters(sexp_termios_type_obj), SEXP_TWO, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-cflag", 1, sexp_termios_get_c_cflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_getters(sexp_termios_type_obj), SEXP_TWO, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-oflag-set!", 2, sexp_termios_set_c_oflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  if (sexp_vectorp(sexp_type_setters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_setters(sexp_termios_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-oflag", 1, sexp_termios_get_c_oflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_getters(sexp_termios_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-iflag-set!", 2, sexp_termios_set_c_iflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  if (sexp_vectorp(sexp_type_setters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_setters(sexp_termios_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-iflag", 1, sexp_termios_get_c_iflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_getters(sexp_termios_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "make-term-attrs", 0, sexp_make_term_attrs_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "winsize-col", 1, sexp_winsize_get_ws_col);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_winsize_type_obj))) sexp_vector_set(sexp_type_getters(sexp_winsize_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "winsize-row", 1, sexp_winsize_get_ws_row);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_winsize_type_obj))) sexp_vector_set(sexp_type_getters(sexp_winsize_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "make-winsize", 2, sexp_make_winsize_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj));
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "set-terminal-attributes!", 3, sexp_set_terminal_attributes_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "get-terminal-attributes", 1, sexp_get_terminal_attributes_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "ioctl", 2, sexp_ioctl_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "term-attrs-ospeed-set!", 2, sexp_term_attrs_ospeed_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "term-attrs-ispeed-set!", 2, sexp_term_attrs_ispeed_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "term-attrs-ospeed", 1, sexp_term_attrs_ospeed_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "term-attrs-ispeed", 1, sexp_term_attrs_ispeed_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}